

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall QMakeEvaluator::checkRequirements(QMakeEvaluator *this,ProStringList *deps)

{
  bool bVar1;
  ProStringList *n;
  const_iterator o;
  ProString *this_00;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  VisitReturn vr;
  ProString *dep;
  ProStringList *__range1;
  ProStringList *failed;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ProKey *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  VisitReturn in_stack_ffffffffffffff14;
  ProKey *in_stack_ffffffffffffff20;
  QMakeEvaluator *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  VisitReturn in_stack_ffffffffffffff3c;
  QStringView *pQVar3;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  VisitReturn VVar4;
  QMakeEvaluator *local_88;
  QString *local_80;
  const_iterator local_50 [7];
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  ProKey::ProKey(in_stack_ffffffffffffff00,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  n = valuesRef(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  ProKey::~ProKey((ProKey *)0x2f76e7);
  local_50[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_50[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffff00);
  o = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffff00);
  do {
    bVar1 = QList<ProString>::const_iterator::operator!=(local_50,o);
    if (!bVar1) {
      VVar4 = ReturnTrue;
LAB_002f7898:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
        return VVar4;
      }
      __stack_chk_fail();
    }
    this_00 = QList<ProString>::const_iterator::operator*(local_50);
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               &local_18);
    QVar2 = QStringView::mid(in_RDI,(qsizetype)in_stack_ffffffffffffff28,(qsizetype)n);
    local_88 = (QMakeEvaluator *)QVar2.m_size;
    local_80 = (QString *)QVar2.m_data;
    ProFile::fileName((ProFile *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QVar2.m_data._0_4_ = in_stack_ffffffffffffff68;
    QVar2.m_size = (qsizetype)pQVar3;
    QVar2.m_data._4_4_ = in_stack_ffffffffffffff6c;
    in_stack_ffffffffffffff14 =
         evaluateConditional((QMakeEvaluator *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),QVar2,
                             local_80,(int)((ulong)local_88 >> 0x20));
    QString::~QString((QString *)0x2f784d);
    if (in_stack_ffffffffffffff14 == ReturnError) {
      VVar4 = ReturnError;
      goto LAB_002f7898;
    }
    in_stack_ffffffffffffff28 = local_88;
    in_stack_ffffffffffffff3c = in_stack_ffffffffffffff14;
    if (in_stack_ffffffffffffff14 != ReturnTrue) {
      ProStringList::operator<<
                ((ProStringList *)this_00,
                 (ProString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff28 = local_88;
    }
    QList<ProString>::const_iterator::operator++(local_50);
  } while( true );
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::checkRequirements(const ProStringList &deps)
{
    ProStringList &failed = valuesRef(ProKey("QMAKE_FAILED_REQUIREMENTS"));
    for (const ProString &dep : deps) {
        VisitReturn vr = evaluateConditional(dep.toQStringView(), m_current.pro->fileName(), m_current.line);
        if (vr == ReturnError)
            return ReturnError;
        if (vr != ReturnTrue)
            failed << dep;
    }
    return ReturnTrue;
}